

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

bool __thiscall
wasm::OptimizeInstructions::areConsecutiveInputsEqualAndRemovable
          (OptimizeInstructions *this,Expression *left,Expression *right)

{
  bool bVar1;
  PassOptions *passOptions;
  EffectAnalyzer local_2f0;
  EffectAnalyzer local_190;
  
  passOptions = &((this->
                  super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                  ).super_Pass.runner)->options;
  EffectAnalyzer::EffectAnalyzer
            (&local_2f0,passOptions,
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
             ).
             super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .
             super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .currModule,left);
  bVar1 = EffectAnalyzer::hasUnremovableSideEffects(&local_2f0);
  if (bVar1) {
    EffectAnalyzer::~EffectAnalyzer(&local_2f0);
  }
  else {
    EffectAnalyzer::EffectAnalyzer
              (&local_190,passOptions,
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
               ).
               super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               .
               super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               .currModule,right);
    bVar1 = EffectAnalyzer::hasUnremovableSideEffects(&local_190);
    EffectAnalyzer::~EffectAnalyzer(&local_190);
    EffectAnalyzer::~EffectAnalyzer(&local_2f0);
    if (!bVar1) {
      bVar1 = areConsecutiveInputsEqual(this,left,right);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool areConsecutiveInputsEqualAndRemovable(Expression* left,
                                             Expression* right) {
    // First, check for side effects. If there are any, then we can't even
    // assume things like local.get's of the same index being identical. (It is
    // also ok to have removable side effects here, see the function
    // description.)
    auto& passOptions = getPassOptions();
    if (EffectAnalyzer(passOptions, *getModule(), left)
          .hasUnremovableSideEffects() ||
        EffectAnalyzer(passOptions, *getModule(), right)
          .hasUnremovableSideEffects()) {
      return false;
    }

    return areConsecutiveInputsEqual(left, right);
  }